

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O3

QString * includeGuard(QString *__return_storage_ptr__,QString *filename)

{
  char16_t cVar1;
  Data *pDVar2;
  bool bVar3;
  char16_t *pcVar4;
  ulong alloc;
  ulong uVar5;
  
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::toUpper_helper(__return_storage_ptr__,filename);
  alloc = (__return_storage_ptr__->d).size;
  if (alloc != 0) {
    pcVar4 = (__return_storage_ptr__->d).ptr;
    uVar5 = 0;
    do {
      cVar1 = pcVar4[uVar5];
      if ((9 < (ushort)cVar1 - 0x30) &&
         (0x39 < (ushort)cVar1 - 0x41 || 0xfffffff9 < (ushort)cVar1 - 0x61)) {
        if (0x7f < (ushort)cVar1) {
          bVar3 = QChar::isLetterOrNumber_helper((uint)(ushort)cVar1);
          if (bVar3) goto LAB_0010a755;
        }
        pDVar2 = (__return_storage_ptr__->d).d;
        if ((pDVar2 == (Data *)0x0) ||
           (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QString::reallocData(__return_storage_ptr__,alloc,KeepSize);
          pcVar4 = (__return_storage_ptr__->d).ptr;
          alloc = (__return_storage_ptr__->d).size;
        }
        pcVar4[uVar5] = L'_';
      }
LAB_0010a755:
      uVar5 = uVar5 + 1;
    } while (uVar5 < alloc);
  }
  return __return_storage_ptr__;
}

Assistant:

QString includeGuard(const QString &filename)
{
    QString guard = filename.toUpper();

    for (int i = 0; i < guard.size(); ++i) {
        if (!guard.at(i).isLetterOrNumber())
            guard[i] = u'_';
    }

    return guard;
}